

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O1

void __thiscall
chrono::ChMatterSPH::FillBox
          (ChMatterSPH *this,ChVector<double> *size,double spacing,double initial_density,
          ChCoordsys<double> *boxcoords,bool do_centeredcube,double kernel_sfactor,double randomness
          )

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  pointer psVar4;
  long *plVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ChMatterSPH *pCVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  undefined7 in_register_00000009;
  int iVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  ChVector<double> pos;
  ChVector<double> pos2;
  ChVector<double> local_f0;
  double local_d8;
  double local_d0;
  double local_c8;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  undefined4 local_ac;
  ChVector<double> local_a8;
  double local_88;
  ChMatterSPH *local_80;
  double local_78;
  ChVector<double> *local_70;
  double local_68;
  ChVector<double> local_60;
  ChVector<double> local_48;
  
  auVar18._8_56_ = in_register_00001208;
  auVar18._0_8_ = spacing;
  local_bc = (int)(size->m_data[0] / spacing);
  local_88 = initial_density;
  local_80 = this;
  local_78 = kernel_sfactor;
  if (local_bc < 1) {
    dVar14 = 0.0;
  }
  else {
    iVar7 = (int)(size->m_data[1] / spacing);
    iVar10 = (int)(size->m_data[2] / spacing);
    local_ac = (undefined4)CONCAT71(in_register_00000009,do_centeredcube);
    dVar14 = (double)((ulong)do_centeredcube * (long)(randomness * 0.5) +
                     (ulong)!do_centeredcube * (long)randomness);
    local_68 = spacing * 0.5;
    local_d8 = 0.0;
    iVar13 = 0;
    iVar8 = 0;
    local_b4 = iVar10;
    local_70 = size;
    do {
      local_b8 = iVar8;
      if (0 < iVar7) {
        iVar8 = 0;
        local_d0 = 0.0;
        do {
          local_b0 = iVar8;
          if (0 < iVar10) {
            auVar23 = ZEXT864(0) << 0x40;
            do {
              auVar2._8_8_ = 0;
              auVar2._0_8_ = local_d8;
              auVar17 = auVar18._0_16_;
              auVar22._8_8_ = 0;
              auVar22._0_8_ = size->m_data[0] * -0.5;
              auVar2 = vfmadd231sd_fma(auVar22,auVar17,auVar2);
              auVar3._8_8_ = 0;
              auVar3._0_8_ = local_d0;
              auVar19._8_8_ = 0;
              auVar19._0_8_ = size->m_data[1] * -0.5;
              auVar3 = vfmadd231sd_fma(auVar19,auVar17,auVar3);
              auVar21._8_8_ = 0;
              auVar21._0_8_ = size->m_data[2] * -0.5;
              auVar17 = vfmadd231sd_fma(auVar21,auVar23._0_16_,auVar17);
              local_f0.m_data[0] = auVar2._0_8_;
              local_f0.m_data[1] = auVar3._0_8_;
              local_f0.m_data[2] = auVar17._0_8_;
              dVar15 = ChRandom();
              dVar16 = ChRandom();
              local_c8 = dVar16 * dVar14 * spacing;
              dVar16 = ChRandom();
              local_f0.m_data[0] = dVar15 * dVar14 * spacing + local_f0.m_data[0];
              local_f0.m_data[1] = local_c8 + local_f0.m_data[1];
              local_f0.m_data[2] = dVar16 * dVar14 * spacing + local_f0.m_data[2];
              ChCoordsys<double>::TransformLocalToParent(boxcoords,&local_f0);
              AddNode(this,&local_48);
              if ((char)local_ac == '\0') {
                iVar13 = iVar13 + 1;
              }
              else {
                local_a8.m_data[0] = local_68 + local_f0.m_data[0];
                local_a8.m_data[1] = local_68 + local_f0.m_data[1];
                local_a8.m_data[2] = local_68 + local_f0.m_data[2];
                dVar15 = ChRandom();
                dVar16 = ChRandom();
                local_c8 = dVar16 * dVar14 * spacing;
                dVar16 = ChRandom();
                local_a8.m_data[0] = dVar15 * dVar14 * spacing + local_a8.m_data[0];
                local_a8.m_data[1] = local_c8 + local_a8.m_data[1];
                local_a8.m_data[2] = dVar16 * dVar14 * spacing + local_a8.m_data[2];
                ChCoordsys<double>::TransformLocalToParent(boxcoords,&local_a8);
                size = local_70;
                AddNode(this,&local_60);
                iVar13 = iVar13 + 2;
              }
              auVar23 = ZEXT864((ulong)(auVar23._0_8_ + 1.0));
              iVar10 = iVar10 + -1;
              auVar18 = ZEXT864((ulong)spacing);
            } while (iVar10 != 0);
          }
          local_d0 = local_d0 + 1.0;
          iVar8 = local_b0 + 1;
          iVar10 = local_b4;
        } while (iVar8 != iVar7);
      }
      local_d8 = local_d8 + 1.0;
      iVar8 = local_b8 + 1;
    } while (iVar8 != local_bc);
    dVar14 = (double)iVar13;
  }
  pCVar6 = local_80;
  dVar15 = size->m_data[0];
  dVar16 = size->m_data[1];
  dVar1 = size->m_data[2];
  iVar10 = (*(local_80->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3c])
                     (local_80);
  if (iVar10 != 0) {
    dVar15 = dVar15 * dVar16 * dVar1 * local_88;
    dVar16 = spacing * local_78;
    dVar1 = spacing * 0.05;
    uVar11 = 0;
    lVar12 = 8;
    do {
      psVar4 = (pCVar6->nodes).
               super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      plVar5 = *(long **)((long)psVar4 + lVar12 + -8);
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&(psVar4->super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr + lVar12);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      if (plVar5 == (long *)0x0) {
        __assert_fail("mnode",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChMatterSPH.cpp"
                      ,0x134,
                      "void chrono::ChMatterSPH::FillBox(const ChVector<>, const double, const double, const ChCoordsys<>, const bool, const double, const double)"
                     );
      }
      plVar5[0x1e] = (long)dVar16;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = dVar16 * 0.5 - (double)plVar5[0x1f];
      auVar2 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar17);
      collision::ChCollisionModelBullet::SetSphereRadius
                ((ChCollisionModelBullet *)plVar5[0x18],(double)plVar5[0x1f],auVar2._0_8_);
      plVar5[0x1f] = (long)dVar1;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = (double)plVar5[0x1e] * 0.5 - dVar1;
      auVar2 = vmaxsd_avx(ZEXT816(0) << 0x40,auVar20);
      collision::ChCollisionModelBullet::SetSphereRadius
                ((ChCollisionModelBullet *)plVar5[0x18],dVar1,auVar2._0_8_);
      (**(code **)(*plVar5 + 0x98))(dVar15 / dVar14,plVar5);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      uVar11 = uVar11 + 1;
      uVar9 = (*(pCVar6->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3c])
                        (pCVar6);
      lVar12 = lVar12 + 0x10;
    } while (uVar11 < uVar9);
  }
  (pCVar6->material).super_ChContinuumMaterial.density = local_88;
  return;
}

Assistant:

void ChMatterSPH::FillBox(const ChVector<> size,
                          const double spacing,
                          const double initial_density,
                          const ChCoordsys<> boxcoords,
                          const bool do_centeredcube,
                          const double kernel_sfactor,
                          const double randomness) {
    int samples_x = (int)(size.x() / spacing);
    int samples_y = (int)(size.y() / spacing);
    int samples_z = (int)(size.z() / spacing);
    int totsamples = 0;

    double mrandomness = randomness;
    if (do_centeredcube)
        mrandomness = randomness * 0.5;

    for (int ix = 0; ix < samples_x; ix++)
        for (int iy = 0; iy < samples_y; iy++)
            for (int iz = 0; iz < samples_z; iz++) {
                ChVector<> pos(ix * spacing - 0.5 * size.x(), iy * spacing - 0.5 * size.y(),
                               iz * spacing - 0.5 * size.z());
                pos += ChVector<>(mrandomness * ChRandom() * spacing, mrandomness * ChRandom() * spacing,
                                  mrandomness * ChRandom() * spacing);
                AddNode(boxcoords.TransformLocalToParent(pos));
                totsamples++;

                if (do_centeredcube) {
                    ChVector<> pos2 = pos + 0.5 * ChVector<>(spacing, spacing, spacing);
                    pos2 += ChVector<>(mrandomness * ChRandom() * spacing, mrandomness * ChRandom() * spacing,
                                       mrandomness * ChRandom() * spacing);
                    AddNode(boxcoords.TransformLocalToParent(pos2));
                    totsamples++;
                }
            }

    double mtotvol = size.x() * size.y() * size.z();
    double mtotmass = mtotvol * initial_density;
    double nodemass = mtotmass / (double)totsamples;
    double kernelrad = kernel_sfactor * spacing;

    for (unsigned int ip = 0; ip < GetNnodes(); ip++) {
        // downcasting
        std::shared_ptr<ChNodeSPH> mnode(nodes[ip]);
        assert(mnode);

        mnode->SetKernelRadius(kernelrad);
        mnode->SetCollisionRadius(spacing * 0.05);
        mnode->SetMass(nodemass);
    }

    GetMaterial().Set_density(initial_density);
}